

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_block.h
# Opt level: O0

void __thiscall vector_block<int,_1024U>::clear(vector_block<int,_1024U> *this)

{
  size_type sVar1;
  reference ppiVar2;
  ulong local_18;
  size_t i;
  vector_block<int,_1024U> *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<int_*,_std::allocator<int_*>_>::size(&this->_index_block);
    if (sVar1 <= local_18) break;
    ppiVar2 = std::vector<int_*,_std::allocator<int_*>_>::operator[](&this->_index_block,local_18);
    free(*ppiVar2);
    local_18 = local_18 + 1;
  }
  std::vector<int_*,_std::allocator<int_*>_>::clear(&this->_index_block);
  this->_insertpos = (int *)0x0;
  this->_left_in_block = 0;
  return;
}

Assistant:

void clear()
	{
		for (size_t i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
		_index_block.clear();
		_insertpos=0;
		_left_in_block=0;
	}